

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O2

void idx2::Resize(volume *Vol,v3i *Dims3,dtype Type,allocator *Alloc)

{
  dtype dVar1;
  long lVar2;
  
  dVar1 = Vol->Type;
  Vol->Type = Type;
  Resize(Vol,Dims3,Alloc);
  if ((ulong)Vol->Type < 10) {
    lVar2 = *(long *)(&DAT_00199b90 + (ulong)Vol->Type * 8);
  }
  else {
    lVar2 = 0;
  }
  if ((Vol->Buffer).Bytes <
      (long)(Dims3->field_0).field_0.Z *
      (long)(Dims3->field_0).field_0.Y * (long)(Dims3->field_0).field_0.X * lVar2) {
    Vol->Type = dVar1;
  }
  return;
}

Assistant:

void
Resize(volume* Vol, const v3i& Dims3, dtype Type, allocator* Alloc)
{
  auto OldType = Vol->Type;
  Vol->Type = Type;
  Resize(Vol, Dims3, Alloc);
  if (Size(Vol->Buffer) < Prod<i64>(Dims3) * SizeOf(Vol->Type))
    Vol->Type = OldType;
}